

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rlgl.h
# Opt level: O1

void rlFrustum(double left,double right,double bottom,double top,double znear,double zfar)

{
  Matrix right_00;
  undefined1 auVar1 [40];
  Matrix *pMVar2;
  float fVar3;
  Matrix matFrustum;
  ulong local_d8;
  long local_c8;
  undefined8 uStack_b0;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  undefined8 local_30;
  undefined8 uStack_28;
  undefined8 local_20;
  undefined8 uStack_18;
  
  pMVar2 = RLGL.State.currentMatrix;
  fVar3 = (float)znear;
  local_d8 = (ulong)(uint)((fVar3 + fVar3) / (float)(right - left));
  local_c8 = (ulong)(uint)((fVar3 + fVar3) / (float)(top - bottom)) << 0x20;
  auVar1 = ZEXT2840(CONCAT424(((float)bottom + (float)top) / (float)(top - bottom),
                              CONCAT816(local_c8,CONCAT412(0,CONCAT48(((float)left + (float)right) /
                                                                      (float)(right - left),local_d8
                                                                     )))));
  right_00.m10 = -(fVar3 + (float)zfar) / (float)(zfar - znear);
  right_00.m14 = (fVar3 * (float)zfar * -2.0) / (float)(zfar - znear);
  right_00.m0 = (float)auVar1._0_4_;
  right_00.m4 = (float)auVar1._4_4_;
  right_00.m8 = (float)auVar1._8_4_;
  right_00.m12 = (float)auVar1._12_4_;
  right_00.m1 = (float)auVar1._16_4_;
  right_00.m5 = (float)auVar1._20_4_;
  right_00.m9 = (float)auVar1._24_4_;
  right_00.m13 = (float)auVar1._28_4_;
  right_00.m2 = (float)auVar1._32_4_;
  right_00.m6 = (float)auVar1._36_4_;
  right_00.m3 = 0.0;
  right_00.m7 = 0.0;
  right_00.m11 = -1.0;
  right_00.m15 = 0.0;
  rlMatrixMultiply(*RLGL.State.currentMatrix,right_00);
  pMVar2->m3 = (float)(undefined4)local_20;
  pMVar2->m7 = (float)local_20._4_4_;
  pMVar2->m11 = (float)(undefined4)uStack_18;
  pMVar2->m15 = (float)uStack_18._4_4_;
  pMVar2->m2 = (float)(undefined4)local_30;
  pMVar2->m6 = (float)local_30._4_4_;
  pMVar2->m10 = (float)(undefined4)uStack_28;
  pMVar2->m14 = (float)uStack_28._4_4_;
  pMVar2->m1 = (float)(undefined4)local_40;
  pMVar2->m5 = (float)local_40._4_4_;
  pMVar2->m9 = (float)(undefined4)uStack_38;
  pMVar2->m13 = (float)uStack_38._4_4_;
  pMVar2->m0 = (float)(undefined4)local_50;
  pMVar2->m4 = (float)local_50._4_4_;
  pMVar2->m8 = (float)(undefined4)uStack_48;
  pMVar2->m12 = (float)uStack_48._4_4_;
  return;
}

Assistant:

void rlFrustum(double left, double right, double bottom, double top, double znear, double zfar)
{
    Matrix matFrustum = { 0 };

    float rl = (float)(right - left);
    float tb = (float)(top - bottom);
    float fn = (float)(zfar - znear);

    matFrustum.m0 = ((float) znear*2.0f)/rl;
    matFrustum.m1 = 0.0f;
    matFrustum.m2 = 0.0f;
    matFrustum.m3 = 0.0f;

    matFrustum.m4 = 0.0f;
    matFrustum.m5 = ((float) znear*2.0f)/tb;
    matFrustum.m6 = 0.0f;
    matFrustum.m7 = 0.0f;

    matFrustum.m8 = ((float)right + (float)left)/rl;
    matFrustum.m9 = ((float)top + (float)bottom)/tb;
    matFrustum.m10 = -((float)zfar + (float)znear)/fn;
    matFrustum.m11 = -1.0f;

    matFrustum.m12 = 0.0f;
    matFrustum.m13 = 0.0f;
    matFrustum.m14 = -((float)zfar*(float)znear*2.0f)/fn;
    matFrustum.m15 = 0.0f;

    *RLGL.State.currentMatrix = rlMatrixMultiply(*RLGL.State.currentMatrix, matFrustum);
}